

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5e4c5e::NoexceptSpec::printLeft(NoexceptSpec *this,OutputStream *S)

{
  Node *pNVar1;
  
  OutputStream::grow(S,9);
  builtin_strncpy(S->Buffer + S->CurrentPosition,"noexcept(",9);
  S->CurrentPosition = S->CurrentPosition + 9;
  pNVar1 = this->E;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "noexcept(";
    E->print(S);
    S += ")";
  }